

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<TFad<6,_double>,_3> * __thiscall
TPZManVector<TFad<6,_double>,_3>::operator=
          (TPZManVector<TFad<6,_double>,_3> *this,TPZManVector<TFad<6,_double>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong *puVar4;
  TFad<6,_double> *pTVar5;
  long lVar6;
  TFad<6,_double> *pTVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar3 = _DAT_012bc110;
  auVar2 = _DAT_012bc100;
  if (this != copy) {
    uVar9 = (copy->super_TPZVec<TFad<6,_double>_>).fNElements;
    lVar6 = (this->super_TPZVec<TFad<6,_double>_>).fNAlloc;
    if ((lVar6 < (long)uVar9) &&
       (pTVar7 = (this->super_TPZVec<TFad<6,_double>_>).fStore,
       pTVar7 != this->fExtAlloc && pTVar7 != (TFad<6,_double> *)0x0)) {
      dVar1 = pTVar7[-1].dx_[5];
      if (dVar1 != 0.0) {
        uVar8 = (long)dVar1 + 0x3ffffffffffffffU & 0x3ffffffffffffff;
        auVar11._8_4_ = (int)uVar8;
        auVar11._0_8_ = uVar8;
        auVar11._12_4_ = (int)(uVar8 >> 0x20);
        pTVar5 = pTVar7 + (long)dVar1 + -1;
        lVar6 = 0;
        auVar11 = auVar11 ^ _DAT_012bc110;
        do {
          auVar13._8_4_ = (int)lVar6;
          auVar13._0_8_ = lVar6;
          auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar13 = (auVar13 | auVar2) ^ auVar3;
          if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                      auVar11._4_4_ < auVar13._4_4_) & 1)) {
            (pTVar5->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
          }
          if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
              auVar13._12_4_ <= auVar11._12_4_) {
            pTVar5[-1].super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
          }
          lVar6 = lVar6 + 2;
          pTVar5 = pTVar5 + -2;
        } while ((uVar8 - ((uint)((long)dVar1 + 0x3ffffffffffffffU) & 1)) + 2 != lVar6);
      }
      operator_delete__(pTVar7[-1].dx_ + 5,(long)dVar1 << 6 | 8);
      (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
      lVar6 = 0;
    }
    auVar3 = _DAT_012bc110;
    auVar2 = _DAT_012bc100;
    if ((long)uVar9 < 4) {
      pTVar7 = (this->super_TPZVec<TFad<6,_double>_>).fStore;
      if (pTVar7 != (TFad<6,_double> *)0x0 && pTVar7 != this->fExtAlloc) {
        dVar1 = pTVar7[-1].dx_[5];
        if (dVar1 != 0.0) {
          uVar8 = (long)dVar1 + 0x3ffffffffffffffU & 0x3ffffffffffffff;
          auVar12._8_4_ = (int)uVar8;
          auVar12._0_8_ = uVar8;
          auVar12._12_4_ = (int)(uVar8 >> 0x20);
          pTVar5 = pTVar7 + (long)dVar1 + -1;
          lVar6 = 0;
          auVar12 = auVar12 ^ _DAT_012bc110;
          do {
            auVar14._8_4_ = (int)lVar6;
            auVar14._0_8_ = lVar6;
            auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar11 = (auVar14 | auVar2) ^ auVar3;
            if ((bool)(~(auVar11._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar11._0_4_ ||
                        auVar12._4_4_ < auVar11._4_4_) & 1)) {
              (pTVar5->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
            }
            if ((auVar11._12_4_ != auVar12._12_4_ || auVar11._8_4_ <= auVar12._8_4_) &&
                auVar11._12_4_ <= auVar12._12_4_) {
              pTVar5[-1].super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
            }
            lVar6 = lVar6 + 2;
            pTVar5 = pTVar5 + -2;
          } while ((uVar8 - ((uint)((long)dVar1 + 0x3ffffffffffffffU) & 1)) + 2 != lVar6);
        }
        operator_delete__(pTVar7[-1].dx_ + 5,(long)dVar1 << 6 | 8);
      }
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
      (this->super_TPZVec<TFad<6,_double>_>).fStore = this->fExtAlloc;
    }
    else if (lVar6 < (long)uVar9) {
      puVar4 = (ulong *)operator_new__(-(ulong)(uVar9 >> 0x3a != 0) | uVar9 * 0x40 | 8);
      *puVar4 = uVar9;
      pTVar7 = (TFad<6,_double> *)(puVar4 + 1);
      do {
        (pTVar7->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
        pTVar7->val_ = 0.0;
        pTVar7->dx_[0] = 0.0;
        pTVar7->dx_[5] = 0.0;
        pTVar7->dx_[1] = 0.0;
        pTVar7->dx_[2] = 0.0;
        pTVar7->dx_[3] = 0.0;
        pTVar7->dx_[4] = 0.0;
        pTVar7 = pTVar7 + 1;
      } while (pTVar7 != (TFad<6,_double> *)(puVar4 + uVar9 * 8 + 1));
      (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)(puVar4 + 1);
      (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = uVar9;
    }
    (this->super_TPZVec<TFad<6,_double>_>).fNElements = uVar9;
    uVar8 = 0;
    if ((long)uVar9 < 1) {
      uVar9 = uVar8;
    }
    while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
      TFad<6,_double>::operator=
                ((TFad<6,_double> *)
                 ((long)((this->super_TPZVec<TFad<6,_double>_>).fStore)->dx_ + (uVar8 - 0x10)),
                 (TFad<6,_double> *)
                 ((long)((copy->super_TPZVec<TFad<6,_double>_>).fStore)->dx_ + (uVar8 - 0x10)));
      uVar8 = uVar8 + 0x40;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}